

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

double log2(double __x)

{
  uint in_EDI;
  
  if (in_EDI == 0) {
    fwrite("log2 0, invalid!\n",0x11,1,_stderr);
    exit(-1);
  }
  for (; 1 < in_EDI; in_EDI = in_EDI >> 1) {
  }
  return __x;
}

Assistant:

uint32_t log2(uint32_t val) {
    if (val == 0) {
        fprintf(stderr, "log2 0, invalid!\n");
        exit(-1);
    }
    uint32_t res = 0;
    while (val > 1) {
        val >>= 1;
        res++;
    }
    return res;
}